

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::Finalize<duckdb::CovarState,double,duckdb::CovarSampOperation>
               (Vector *states,AggregateInputData *aggr_input_data,Vector *result,idx_t count,
               idx_t offset)

{
  ulong uVar1;
  data_ptr_t pdVar2;
  data_ptr_t pdVar3;
  long lVar4;
  idx_t iVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  AggregateFinalizeData finalize_data;
  AggregateFinalizeData local_48;
  
  local_48.result = result;
  local_48.input = aggr_input_data;
  if (states->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    local_48.result_idx = 0;
    uVar1 = **(ulong **)states->data;
    if (uVar1 < 2) {
      AggregateFinalizeData::ReturnNull(&local_48);
    }
    else {
      lVar4 = uVar1 - 1;
      auVar6._8_4_ = (int)((ulong)lVar4 >> 0x20);
      auVar6._0_8_ = lVar4;
      auVar6._12_4_ = 0x45300000;
      *(double *)result->data =
           (double)(*(ulong **)states->data)[3] /
           ((auVar6._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0));
    }
  }
  else {
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar2 = states->data;
    pdVar3 = result->data;
    if (count != 0) {
      iVar5 = 0;
      do {
        local_48.result_idx = offset + iVar5;
        uVar1 = **(ulong **)(pdVar2 + iVar5 * 8);
        if (uVar1 < 2) {
          AggregateFinalizeData::ReturnNull(&local_48);
        }
        else {
          lVar4 = uVar1 - 1;
          auVar7._8_4_ = (int)((ulong)lVar4 >> 0x20);
          auVar7._0_8_ = lVar4;
          auVar7._12_4_ = 0x45300000;
          *(double *)(pdVar3 + iVar5 * 8 + offset * 8) =
               (double)(*(ulong **)(pdVar2 + iVar5 * 8))[3] /
               ((auVar7._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0));
        }
        iVar5 = iVar5 + 1;
      } while (count != iVar5);
    }
  }
  return;
}

Assistant:

static void Finalize(Vector &states, AggregateInputData &aggr_input_data, Vector &result, idx_t count,
	                     idx_t offset) {
		if (states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);

			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			auto rdata = ConstantVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			OP::template Finalize<RESULT_TYPE, STATE_TYPE>(**sdata, *rdata, finalize_data);
		} else {
			D_ASSERT(states.GetVectorType() == VectorType::FLAT_VECTOR);
			result.SetVectorType(VectorType::FLAT_VECTOR);

			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			auto rdata = FlatVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			for (idx_t i = 0; i < count; i++) {
				finalize_data.result_idx = i + offset;
				OP::template Finalize<RESULT_TYPE, STATE_TYPE>(*sdata[i], rdata[finalize_data.result_idx],
				                                               finalize_data);
			}
		}
	}